

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

bool __thiscall
ON_EarthAnchorPoint::GetModelCompass(ON_EarthAnchorPoint *this,ON_Plane *model_compass)

{
  bool bVar1;
  double dVar2;
  ON_3dVector local_d8;
  double local_c0;
  double d;
  undefined1 auStack_a8 [8];
  ON_Plane mc;
  ON_Plane *model_compass_local;
  ON_EarthAnchorPoint *this_local;
  
  ON_Plane::ON_Plane((ON_Plane *)auStack_a8);
  mc.xaxis.y = (this->m_model_east).z;
  mc.origin.z = (this->m_model_east).x;
  mc.xaxis.x = (this->m_model_east).y;
  mc.yaxis.y = (this->m_model_north).z;
  mc.xaxis.z = (this->m_model_north).x;
  mc.yaxis.x = (this->m_model_north).y;
  dVar2 = ON_3dVector::Length((ON_3dVector *)&mc.origin.z);
  if ((ABS(dVar2 - 1.0) <= 1.490116119385e-08) ||
     (bVar1 = ON_3dVector::Unitize((ON_3dVector *)&mc.origin.z), bVar1)) {
    dVar2 = ON_3dVector::Length((ON_3dVector *)&mc.xaxis.z);
    if ((ABS(dVar2 - 1.0) <= 1.490116119385e-08) ||
       (bVar1 = ON_3dVector::Unitize((ON_3dVector *)&mc.xaxis.z), bVar1)) {
      local_c0 = ON_3dVector::operator*((ON_3dVector *)&mc.origin.z,(ON_3dVector *)&mc.xaxis.z);
      if (1.490116119385e-08 < ABS(local_c0)) {
        mc.origin.z = mc.origin.z - local_c0 * mc.xaxis.z;
        mc.xaxis.x = mc.xaxis.x - local_c0 * mc.yaxis.x;
        mc.xaxis.y = mc.xaxis.y - local_c0 * mc.yaxis.y;
        bVar1 = ON_3dVector::Unitize((ON_3dVector *)&mc.origin.z);
        if (!bVar1) {
          this_local._7_1_ = false;
          goto LAB_0045b5ba;
        }
      }
      ON_CrossProduct(&local_d8,(ON_3dVector *)&mc.origin.z,(ON_3dVector *)&mc.xaxis.z);
      mc.zaxis.y = local_d8.z;
      mc.yaxis.z = local_d8.x;
      mc.zaxis.x = local_d8.y;
      dVar2 = ON_3dVector::Length((ON_3dVector *)&mc.yaxis.z);
      if ((ABS(dVar2 - 1.0) <= 1.490116119385e-08) ||
         (bVar1 = ON_3dVector::Unitize((ON_3dVector *)&mc.yaxis.z), bVar1)) {
        mc.origin.y = (this->m_model_point).z;
        auStack_a8 = (undefined1  [8])(this->m_model_point).x;
        mc.origin.x = (this->m_model_point).y;
        ON_Plane::UpdateEquation((ON_Plane *)auStack_a8);
        (model_compass->plane_equation).z = mc.plane_equation.y;
        (model_compass->plane_equation).d = mc.plane_equation.z;
        (model_compass->plane_equation).x = mc.zaxis.z;
        (model_compass->plane_equation).y = mc.plane_equation.x;
        (model_compass->zaxis).y = mc.zaxis.x;
        (model_compass->zaxis).z = mc.zaxis.y;
        (model_compass->yaxis).z = mc.yaxis.y;
        (model_compass->zaxis).x = mc.yaxis.z;
        (model_compass->yaxis).x = mc.xaxis.z;
        (model_compass->yaxis).y = mc.yaxis.x;
        (model_compass->xaxis).y = mc.xaxis.x;
        (model_compass->xaxis).z = mc.xaxis.y;
        (model_compass->origin).z = mc.origin.y;
        (model_compass->xaxis).x = mc.origin.z;
        (model_compass->origin).x = (double)auStack_a8;
        (model_compass->origin).y = mc.origin.x;
        this_local._7_1_ = ON_Plane::IsValid(model_compass);
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
LAB_0045b5ba:
  d._0_4_ = 1;
  ON_Plane::~ON_Plane((ON_Plane *)auStack_a8);
  return this_local._7_1_;
}

Assistant:

bool ON_EarthAnchorPoint::GetModelCompass(ON_Plane& model_compass) const
{
  ON_Plane mc;
  mc.xaxis = m_model_east;
  mc.yaxis = m_model_north;
  if ( fabs(mc.xaxis.Length() - 1.0) > ON_SQRT_EPSILON )
  {
    if ( !mc.xaxis.Unitize() )
      return false;
  }
  if ( fabs(mc.yaxis.Length() - 1.0) > ON_SQRT_EPSILON )
  {
    if ( !mc.yaxis.Unitize() )
      return false;
  }
  double d = mc.xaxis*mc.yaxis;
  if ( fabs(d) > ON_SQRT_EPSILON )
  {
    // assume north is correct
    mc.xaxis.x -= d*mc.yaxis.x;
    mc.xaxis.y -= d*mc.yaxis.y;
    mc.xaxis.z -= d*mc.yaxis.z;
    if( !mc.xaxis.Unitize() )
      return false;
  }
  mc.zaxis = ON_CrossProduct(mc.xaxis,mc.yaxis);
  if ( fabs(mc.zaxis.Length() - 1.0) > ON_SQRT_EPSILON )
  {
    if ( !mc.zaxis.Unitize() )
      return false;
  }
  mc.origin = m_model_point;
  mc.UpdateEquation();
  model_compass = mc;
  return model_compass.IsValid();
}